

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupRepresentationParser.cpp
# Opt level: O3

vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
* van_kampen::GroupRepresentationParser::parse
            (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             *__return_storage_ptr__,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  pointer pcVar4;
  invalid_argument *piVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pbVar8;
  pointer pcVar9;
  pointer pbVar10;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> curWord;
  GroupElement local_158;
  vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
  *local_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  long *local_c8;
  ulong local_c0;
  long local_b8 [2];
  pointer local_a8;
  pointer local_a0;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar9 = (text->_M_dataplus)._M_p;
  local_130 = (vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
               *)__return_storage_ptr__;
  lVar3 = std::__cxx11::string::find((char *)text,0x153332,0);
  paVar1 = &local_158.name.field_2;
  local_158.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"FreeGroup( ","");
  lVar3 = local_158.name._M_string_length + lVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.name._M_dataplus._M_p,local_158.name.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar4 = (text->_M_dataplus)._M_p;
  lVar3 = std::__cxx11::string::find((char *)text,0x15333e,(ulong)(pcVar9 + (lVar3 - (long)pcVar4)))
  ;
  pcVar9 = (text->_M_dataplus)._M_p;
  lVar3 = std::__cxx11::string::find((char *)text,0x153342,(ulong)(pcVar4 + (lVar3 - (long)pcVar9)))
  ;
  paVar1 = &local_158.name.field_2;
  local_158.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"[ ","");
  pcVar9 = pcVar9 + local_158.name._M_string_length + lVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.name._M_dataplus._M_p,local_158.name.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar4 = (text->_M_dataplus)._M_p;
  lVar3 = std::__cxx11::string::find((char *)text,0x153345,(long)pcVar9 - (long)pcVar4);
  pcVar4 = pcVar4 + lVar3;
  pcVar2 = (text->_M_dataplus)._M_p;
  if ((pcVar2 <= pcVar4) && (pcVar4 <= pcVar2 + text->_M_string_length)) {
    *(undefined8 *)local_130 = 0;
    *(pointer *)(local_130 + 8) = (pointer)0x0;
    *(pointer *)(local_130 + 0x10) = (pointer)0x0;
    local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_158,pcVar9,pcVar4);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,", ","");
    split_by_delim(&local_68,&local_158.name,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.name._M_dataplus._M_p != &local_158.name.field_2) {
      operator_delete(local_158.name._M_dataplus._M_p,
                      local_158.name.field_2._M_allocated_capacity + 1);
    }
    local_a8 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_108.field_2;
      pbVar10 = local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        pcVar9 = (pbVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar9,pcVar9 + pbVar10->_M_string_length);
        local_98.
        super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.
        super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.
        super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"*","");
        split_by_delim(&local_80,&local_128,&local_158.name);
        pbVar8 = local_80.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_a0 = pbVar10;
        pbVar10 = local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.name._M_dataplus._M_p != &local_158.name.field_2) {
          operator_delete(local_158.name._M_dataplus._M_p,
                          local_158.name.field_2._M_allocated_capacity + 1);
          pbVar8 = local_80.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = local_80.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar8 != pbVar10; pbVar8 = pbVar8 + 1) {
          local_c8 = local_b8;
          pcVar9 = (pbVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar9,pcVar9 + pbVar8->_M_string_length);
          std::__cxx11::string::find((char)(string *)&local_c8,0x5e);
          std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_c8);
          if (*local_108._M_dataplus._M_p == '(') {
            if (local_108._M_string_length < 2) {
              piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::operator+(&local_e8,"can not parse pattern \'",&local_108);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_158.name._M_dataplus._M_p = (pointer)*plVar6;
              psVar7 = (size_type *)(plVar6 + 2);
              if ((size_type *)local_158.name._M_dataplus._M_p == psVar7) {
                local_158.name.field_2._M_allocated_capacity = *psVar7;
                local_158.name.field_2._8_8_ = plVar6[3];
                local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
              }
              else {
                local_158.name.field_2._M_allocated_capacity = *psVar7;
              }
              local_158.name._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::invalid_argument::invalid_argument(piVar5,(string *)&local_158);
              __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_108);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          local_158.reversed = local_108._M_string_length != local_c0;
          local_158.name._M_dataplus._M_p = local_108._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p == paVar1) {
            local_158.name.field_2._8_8_ = local_108.field_2._8_8_;
            local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
          }
          local_158.name.field_2._M_allocated_capacity._1_7_ =
               local_108.field_2._M_allocated_capacity._1_7_;
          local_158.name.field_2._M_local_buf[0] = local_108.field_2._M_local_buf[0];
          local_158.name._M_string_length = local_108._M_string_length;
          local_108._M_string_length = 0;
          local_108.field_2._M_local_buf[0] = '\0';
          local_108._M_dataplus._M_p = (pointer)paVar1;
          std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::
          emplace_back<van_kampen::GroupElement>(&local_98,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.name._M_dataplus._M_p != &local_158.name.field_2) {
            operator_delete(local_158.name._M_dataplus._M_p,
                            local_158.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != paVar1) {
            operator_delete(local_108._M_dataplus._M_p,
                            CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                     local_108.field_2._M_local_buf[0]) + 1);
          }
          if (local_c8 != local_b8) {
            operator_delete(local_c8,local_b8[0] + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        std::
        vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
        ::
        emplace_back<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>
                  (local_130,&local_98);
        std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
                  (&local_98);
        pbVar10 = local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_a8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            *)local_130;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"invalid group representation format");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<std::vector<GroupElement>> GroupRepresentationParser::parse(const std::string &text)
{
    auto withoutBorders = [](const std::string &s) {
        if (s.length() < 2)
        {
            throw std::invalid_argument("can not parse pattern '" + s + "'");
        }
        return s.substr(1, s.length() - 2);
    };

    auto alphabetBegin = text.begin() + text.find("FreeGroup( ") + std::string("FreeGroup( ").length();
    auto alphabetEnd = text.begin() + text.find(" );", std::distance(text.begin(), alphabetBegin));

    auto wordsBegin = text.begin() + text.find("[ ", std::distance(text.begin(), alphabetEnd)) + std::string("[ ").length();
    auto wordsEnd = text.begin() + text.find(" ]", std::distance(text.begin(), wordsBegin));

    if (!(text.begin() <= wordsEnd && wordsEnd <= text.end()))
    {
        throw std::invalid_argument("invalid group representation format");
    }

    std::vector<std::vector<van_kampen::GroupElement>> words;

    for (auto word : van_kampen::split_by_delim({wordsBegin, wordsEnd}, ", "))
    {
        std::vector<van_kampen::GroupElement> curWord;
        for (auto c : van_kampen::split_by_delim(word, "*"))
        {
            auto powChar = c.find('^') + c.begin();
            auto element = c.substr(0, powChar - c.begin());
            if (element[0] == '(')
            {
                element = withoutBorders(element);
            }
            bool reversed = element.size() != c.size();
            curWord.emplace_back(GroupElement{std::move(element), reversed});
        }
        words.emplace_back(std::move(curWord));
    }

    return words;
}